

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O3

void ngx_time_init(void)

{
  ngx_cached_err_log_time.len = 0x13;
  ngx_cached_http_time.len = 0x1d;
  ngx_cached_http_log_time.len = 0x1a;
  ngx_cached_http_log_iso8601.len = 0x19;
  ngx_cached_syslog_time.len = 0xf;
  ngx_cached_time = cached_time;
  ngx_time_update();
  return;
}

Assistant:

void
ngx_time_init(void)
{
    ngx_cached_err_log_time.len = sizeof("1970/09/28 12:00:00") - 1;
    ngx_cached_http_time.len = sizeof("Mon, 28 Sep 1970 06:00:00 GMT") - 1;
    ngx_cached_http_log_time.len = sizeof("28/Sep/1970:12:00:00 +0600") - 1;
    ngx_cached_http_log_iso8601.len = sizeof("1970-09-28T12:00:00+06:00") - 1;
    ngx_cached_syslog_time.len = sizeof("Sep 28 12:00:00") - 1;

    ngx_cached_time = &cached_time[0];

    ngx_time_update();
}